

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall QPDF::calculateHSharedObject(QPDF *this,NewObjTable *new_obj,ObjTable *obj)

{
  int iVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  pointer pCVar3;
  iterator __position;
  pointer pHVar4;
  bool bVar5;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *pvVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  Object *pOVar10;
  NewObject *this_00;
  qpdf_offset_t qVar11;
  long lVar12;
  pointer pHVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int local_74;
  string local_58;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *local_38;
  
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  pHVar13 = *(pointer *)
             &((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
              ((long)&(_Var2._M_head_impl)->shared_object_hints + 0x28))->
              super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
  ;
  if (*(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30) != pHVar13) {
    *(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30) = pHVar13;
  }
  pCVar3 = *(pointer *)
            &((vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_> *)
             ((long)&(_Var2._M_head_impl)->c_shared_object_data + 0x10))->
             super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
  ;
  if (*(pointer *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 0x18) == pCVar3) {
    uVar15 = 0;
    uVar9 = 0;
  }
  else {
    local_38 = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
               ((long)&(_Var2._M_head_impl)->shared_object_hints + 0x28);
    iVar7 = outputLengthNextN(this,pCVar3->object,1,new_obj,obj);
    lVar16 = 0;
    uVar15 = 0;
    local_74 = iVar7;
    while( true ) {
      iVar8 = *(int *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 8);
      if (iVar8 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar8);
        iVar8 = *(int *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 8);
      }
      uVar9 = (ulong)iVar8;
      if (uVar9 <= uVar15) break;
      lVar12 = *(long *)&((vector<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
                           *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 0x10))->
                         super__Vector_base<QPDF::CHSharedObjectEntry,_std::allocator<QPDF::CHSharedObjectEntry>_>
      ;
      uVar9 = (long)*(pointer *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 0x18) - lVar12
              >> 2;
      if (uVar9 <= uVar15) goto LAB_0021afc8;
      iVar8 = outputLengthNextN(this,*(int *)(lVar12 + uVar15 * 4),1,new_obj,obj);
      pvVar6 = local_38;
      if (iVar8 < iVar7) {
        iVar7 = iVar8;
      }
      if (local_74 <= iVar8) {
        local_74 = iVar8;
      }
      __position._M_current = *(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30);
      if (__position._M_current ==
          *(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x38)) {
        std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::
        _M_realloc_insert<>(local_38,__position);
        pHVar13 = *(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30);
      }
      else {
        (__position._M_current)->nobjects_minus_one = 0;
        (__position._M_current)->delta_group_length = 0;
        (__position._M_current)->signature_present = 0;
        pHVar13 = *(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30) + 1;
        *(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30) = pHVar13;
      }
      pHVar4 = (pvVar6->
               super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar9 = ((long)pHVar13 - (long)pHVar4 >> 2) * -0x5555555555555555;
      if (uVar9 < uVar15 || uVar9 - uVar15 == 0) goto LAB_0021afc8;
      *(int *)((long)&pHVar4->delta_group_length + lVar16) = iVar8;
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0xc;
    }
    pHVar13 = *(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30);
    lVar16 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                         *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x28))->
                       super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
    ;
    if (iVar8 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar8);
      iVar8 = *(int *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 8);
      uVar9 = (ulong)iVar8;
    }
    if (((long)pHVar13 - lVar16 >> 2) * -0x5555555555555555 - uVar9 != 0) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_58,"soe has wrong size after initialization","");
      stopOnError(this,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      iVar8 = *(int *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 8);
    }
    *(int *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x14) = iVar8;
    iVar1 = *(int *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 4);
    *(int *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x10) = iVar1;
    if (iVar1 < iVar8) {
      pOVar10 = ObjTable<QPDFWriter::Object>::element
                          (&obj->super_ObjTable<QPDFWriter::Object>,
                           (long)((_Var2._M_head_impl)->c_shared_object_data).first_shared_obj);
      iVar8 = pOVar10->renumber;
      ((_Var2._M_head_impl)->shared_object_hints).first_shared_obj = iVar8;
      *(int *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x1c) = iVar7;
      this_00 = ObjTable<QPDFWriter::NewObject>::element
                          (&new_obj->super_ObjTable<QPDFWriter::NewObject>,(long)iVar8);
      qVar11 = QPDFXRefEntry::getOffset(&this_00->xref);
      *(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->shared_object_hints + 8) = qVar11;
    }
    *(int *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x1c) = iVar7;
    iVar8 = 0;
    uVar14 = local_74 - iVar7;
    if (uVar14 != 0) {
      do {
        iVar8 = iVar8 + 1;
        bVar5 = 1 < uVar14;
        uVar14 = (int)uVar14 >> 1;
      } while (bVar5);
    }
    *(int *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x20) = iVar8;
    lVar16 = 0;
    uVar15 = 0;
    while( true ) {
      iVar8 = *(int *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 8);
      if (iVar8 < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar8);
        iVar8 = *(int *)((long)&(_Var2._M_head_impl)->c_shared_object_data + 8);
      }
      if ((ulong)(long)iVar8 <= uVar15) {
        return;
      }
      lVar12 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                           *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x28))->
                         super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
      ;
      uVar9 = ((long)*(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30) - lVar12
              >> 2) * -0x5555555555555555;
      if (uVar9 < uVar15 || uVar9 - uVar15 == 0) break;
      if (*(int *)(lVar12 + lVar16) < iVar7) {
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,
                   "found too small group length while writing linearization data","");
        stopOnError(this,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        lVar12 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                             *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x28))->
                           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
        ;
        uVar9 = ((long)*(pointer *)((long)&(_Var2._M_head_impl)->shared_object_hints + 0x30) -
                 lVar12 >> 2) * -0x5555555555555555;
      }
      if (uVar9 <= uVar15) break;
      *(int *)(lVar12 + lVar16) = *(int *)(lVar12 + lVar16) - iVar7;
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0xc;
    }
  }
LAB_0021afc8:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15,
             uVar9);
}

Assistant:

void
QPDF::calculateHSharedObject(
    QPDFWriter::NewObjTable const& new_obj, QPDFWriter::ObjTable const& obj)
{
    CHSharedObject& cso = m->c_shared_object_data;
    std::vector<CHSharedObjectEntry>& csoe = cso.entries;
    HSharedObject& so = m->shared_object_hints;
    std::vector<HSharedObjectEntry>& soe = so.entries;
    soe.clear();

    int min_length = outputLengthNextN(csoe.at(0).object, 1, new_obj, obj);
    int max_length = min_length;

    for (size_t i = 0; i < toS(cso.nshared_total); ++i) {
        // Assign absolute numbers to deltas; adjust later
        int length = outputLengthNextN(csoe.at(i).object, 1, new_obj, obj);
        min_length = std::min(min_length, length);
        max_length = std::max(max_length, length);
        soe.emplace_back();
        soe.at(i).delta_group_length = length;
    }
    if (soe.size() != toS(cso.nshared_total)) {
        stopOnError("soe has wrong size after initialization");
    }

    so.nshared_total = cso.nshared_total;
    so.nshared_first_page = cso.nshared_first_page;
    if (so.nshared_total > so.nshared_first_page) {
        so.first_shared_obj = obj[cso.first_shared_obj].renumber;
        so.min_group_length = min_length;
        so.first_shared_offset = new_obj[so.first_shared_obj].xref.getOffset();
    }
    so.min_group_length = min_length;
    so.nbits_delta_group_length = nbits(max_length - min_length);

    for (size_t i = 0; i < toS(cso.nshared_total); ++i) {
        // Adjust deltas
        if (soe.at(i).delta_group_length < min_length) {
            stopOnError("found too small group length while writing linearization data");
        }
        soe.at(i).delta_group_length -= min_length;
    }
}